

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O3

void __thiscall Octree::build(Octree *this,Mesh *m)

{
  Box *pbox;
  Vector3f *this_00;
  float fVar1;
  pointer pTVar2;
  float *pfVar3;
  ulong uVar4;
  int vi;
  long lVar5;
  int dim;
  int i;
  size_type __n;
  Vector3f *this_01;
  vector<int,_std::allocator<int>_> trigs;
  allocator_type local_61;
  Octree *local_60;
  Mesh *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  this->mesh = m;
  pTVar2 = (m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 == (m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    __assert_fail("!tri.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Octree.cpp"
                  ,0x73,"void Octree::build(Mesh *)");
  }
  pbox = &this->box;
  Vector3f::operator=(&pbox->mn,(Vector3f *)&pTVar2->field_0x30);
  this_00 = &(this->box).mx;
  local_60 = this;
  Vector3f::operator=(this_00,(Vector3f *)
                              &((m->_triangles).
                                super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                                super__Vector_impl_data._M_start)->field_0x30);
  pTVar2 = (m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish == pTVar2) {
    __n = 0;
  }
  else {
    uVar4 = 0;
    local_58 = m;
    do {
      lVar5 = 0;
      local_50 = uVar4;
      do {
        this_01 = (Vector3f *)(&pTVar2[uVar4].field_0x30 + lVar5 * 0xc);
        i = 0;
        do {
          pfVar3 = Vector3f::operator[](&pbox->mn,i);
          fVar1 = *pfVar3;
          pfVar3 = Vector3f::operator[](this_01,i);
          if (*pfVar3 <= fVar1 && fVar1 != *pfVar3) {
            pfVar3 = Vector3f::operator[](this_01,i);
            fVar1 = *pfVar3;
            pfVar3 = Vector3f::operator[](&pbox->mn,i);
            *pfVar3 = fVar1;
          }
          pfVar3 = Vector3f::operator[](this_00,i);
          fVar1 = *pfVar3;
          pfVar3 = Vector3f::operator[](this_01,i);
          if (fVar1 < *pfVar3) {
            pfVar3 = Vector3f::operator[](this_01,i);
            fVar1 = *pfVar3;
            pfVar3 = Vector3f::operator[](this_00,i);
            *pfVar3 = fVar1;
          }
          i = i + 1;
        } while (i != 3);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      uVar4 = (ulong)((int)local_50 + 1);
      pTVar2 = (local_58->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __n = ((long)(local_58->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
            -0x1111111111111111;
    } while (uVar4 <= __n && __n - uVar4 != 0);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_61);
  if ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    uVar4 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = (int)uVar4;
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) <
             (ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  buildNode(local_60,&local_60->root,pbox,&local_48,local_60->mesh,0);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
Octree::build(Mesh *m) {
    mesh = m;

    const auto &tri = mesh->getTriangles();
    assert(!tri.empty());

    // compute bounding box for m
    box.mn = tri[0].getVertex(0);
    box.mx = tri[0].getVertex(0);
    for (unsigned int ii = 0; ii < tri.size(); ii++) {
        const auto &t = tri[ii];
        for (int vi = 0; vi < 3; ++vi) {
            const auto &v = t.getVertex(vi);
            for (int dim = 0; dim < 3; dim++) {
                if (box.mn[dim] > v[dim]) {
                    box.mn[dim] = v[dim];
                }
                if (box.mx[dim] < v[dim]) {
                    box.mx[dim] = v[dim];
                }
            }
        }
    }

    std::vector<int> trigs(tri.size());
    for (unsigned int ii = 0; ii < trigs.size(); ii++) {
        trigs[ii] = ii;
    }
    buildNode(&root, box, trigs, *mesh, 0);
}